

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  pointer pGVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  pointer __x;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  GraphDatabase graph_data_base;
  Graph g;
  ColorRefinementAmenability cra;
  double local_f8;
  GraphDatabase local_f0;
  long local_d8;
  string local_d0;
  Graph local_b0;
  ColorRefinementAmenability local_70;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"NCI1","");
  AuxiliaryMethods::read_graph_txt_file(&local_f0,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Graph data base loaded.",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  local_d8 = std::chrono::_V2::system_clock::now();
  pGVar1 = local_f0.super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (local_f0.super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>._M_impl
      .super__Vector_impl_data._M_start ==
      local_f0.super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    dVar6 = 0.0;
  }
  else {
    local_f8 = 0.0;
    __x = local_f0.super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>.
          _M_impl.super__Vector_impl_data._M_start;
    do {
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector(&local_b0.m_adjacency_lists,&__x->m_adjacency_lists);
      local_b0.m_num_nodes = __x->m_num_nodes;
      local_b0.m_num_edges = __x->m_num_edges;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_b0.m_node_labels,&__x->m_node_labels);
      ColorRefinementAmenability::ColorRefinementAmenability::ColorRefinementAmenability
                (&local_70,&local_b0);
      bVar2 = ColorRefinementAmenability::ColorRefinementAmenability::check_amenability(&local_70);
      dVar6 = local_f8 + 1.0;
      if (!bVar2) {
        dVar6 = local_f8;
      }
      ColorRefinementAmenability::ColorRefinementAmenability::~ColorRefinementAmenability(&local_70)
      ;
      GraphLibrary::Graph::~Graph(&local_b0);
      __x = __x + 1;
      local_f8 = dVar6;
    } while (__x != pGVar1);
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  lVar4 = (long)local_f0.
                super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_f0.
                super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>.
                _M_impl.super__Vector_impl_data._M_start >> 6;
  auVar7._8_4_ = (int)((long)local_f0.
                             super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_f0.
                             super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 0x26);
  auVar7._0_8_ = lVar4;
  auVar7._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     ((dVar6 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0))) *
                      100.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running time [s]: ",0x12);
  lVar4 = (long)local_f0.
                super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_f0.
                super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>.
                _M_impl.super__Vector_impl_data._M_start >> 6;
  auVar8._8_4_ = (int)((long)local_f0.
                             super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_f0.
                             super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 0x26);
  auVar8._0_8_ = lVar4;
  auVar8._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (((double)(lVar3 - local_d8) / 1000000000.0) /
                      ((auVar8._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>::~vector(&local_f0);
  return 0;
}

Assistant:

int main() {
    GraphDatabase graph_data_base = AuxiliaryMethods::read_graph_txt_file("NCI1");
    cout << "Graph data base loaded." << endl;

    double num_is_amenable = 0;
    auto start = chrono::high_resolution_clock::now();
    for (const auto g: graph_data_base) {
        ColorRefinementAmenability::ColorRefinementAmenability cra(g);
        if (cra.check_amenability()) {
            num_is_amenable += 1;
        }
    }
    auto end = chrono::high_resolution_clock::now();

    cout << num_is_amenable / graph_data_base.size() * 100.0 << endl;
    cout << "Running time [s]: " << chrono::duration<double>(end - start).count() / graph_data_base.size() << endl;

    return 0;
}